

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

int __thiscall TiXmlElement::QueryBoolAttribute(TiXmlElement *this,char *name,bool *bval)

{
  bool bVar1;
  TiXmlAttribute *this_00;
  char *pcVar2;
  int result;
  TiXmlAttribute *node;
  bool *bval_local;
  char *name_local;
  TiXmlElement *this_local;
  
  this_00 = TiXmlAttributeSet::Find(&this->attributeSet,name);
  if (this_00 == (TiXmlAttribute *)0x0) {
    return 1;
  }
  pcVar2 = TiXmlAttribute::Value(this_00);
  bVar1 = TiXmlBase::StringEqual(pcVar2,"true",true,TIXML_ENCODING_UNKNOWN);
  if (!bVar1) {
    pcVar2 = TiXmlAttribute::Value(this_00);
    bVar1 = TiXmlBase::StringEqual(pcVar2,"yes",true,TIXML_ENCODING_UNKNOWN);
    if (!bVar1) {
      pcVar2 = TiXmlAttribute::Value(this_00);
      bVar1 = TiXmlBase::StringEqual(pcVar2,"1",true,TIXML_ENCODING_UNKNOWN);
      if (!bVar1) {
        pcVar2 = TiXmlAttribute::Value(this_00);
        bVar1 = TiXmlBase::StringEqual(pcVar2,"false",true,TIXML_ENCODING_UNKNOWN);
        if (!bVar1) {
          pcVar2 = TiXmlAttribute::Value(this_00);
          bVar1 = TiXmlBase::StringEqual(pcVar2,"no",true,TIXML_ENCODING_UNKNOWN);
          if (!bVar1) {
            pcVar2 = TiXmlAttribute::Value(this_00);
            bVar1 = TiXmlBase::StringEqual(pcVar2,"0",true,TIXML_ENCODING_UNKNOWN);
            if (!bVar1) {
              return 2;
            }
          }
        }
        *bval = false;
        return 0;
      }
    }
  }
  *bval = true;
  return 0;
}

Assistant:

int TiXmlElement::QueryBoolAttribute( const char* name, bool* bval ) const
{
	const TiXmlAttribute* node = attributeSet.Find( name );
	if ( !node )
		return TIXML_NO_ATTRIBUTE;
	
	int result = TIXML_WRONG_TYPE;
	if (    StringEqual( node->Value(), "true", true, TIXML_ENCODING_UNKNOWN ) 
		 || StringEqual( node->Value(), "yes", true, TIXML_ENCODING_UNKNOWN ) 
		 || StringEqual( node->Value(), "1", true, TIXML_ENCODING_UNKNOWN ) ) 
	{
		*bval = true;
		result = TIXML_SUCCESS;
	}
	else if (    StringEqual( node->Value(), "false", true, TIXML_ENCODING_UNKNOWN ) 
			  || StringEqual( node->Value(), "no", true, TIXML_ENCODING_UNKNOWN ) 
			  || StringEqual( node->Value(), "0", true, TIXML_ENCODING_UNKNOWN ) ) 
	{
		*bval = false;
		result = TIXML_SUCCESS;
	}
	return result;
}